

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt * __thiscall slang::SVInt::operator--(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint32_t i;
  ulong uVar6;
  bool bVar7;
  
  uVar3 = (this->super_SVIntStorage).bitWidth;
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((this->super_SVIntStorage).field_0.val - 1);
  }
  else if ((bVar2 & 1U) == 0) {
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    uVar6 = 0;
    bVar7 = false;
    do {
      if ((uVar3 + 0x3f >> 6) << (bVar2 & 0x1fU) == uVar6) break;
      puVar1 = puVar4 + uVar6;
      uVar5 = (ulong)bVar7;
      bVar7 = *puVar1 == 0 || *puVar1 - 1 < uVar5;
      *puVar1 = (*puVar1 - 1) - uVar5;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  else {
    setAllX(this);
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator--() {
    if (isSingleWord())
        --val;
    else if (unknownFlag)
        setAllX();
    else
        subOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}